

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BayesianGameCollaborativeGraphical.cpp
# Opt level: O0

void __thiscall
BayesianGameCollaborativeGraphical::SetProbabilityDistribution
          (BayesianGameCollaborativeGraphical *this,PDDiscreteInterface *pd)

{
  value_type pBVar1;
  long lVar2;
  reference ppBVar3;
  BayesianGameBase *this_00;
  BayesianGameBase *pBVar4;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *p_00;
  long *in_RSI;
  long *in_RDI;
  double p;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *indTypes_e;
  Index jtI_e;
  Scope *sc_e;
  BayesianGameIdenticalPayoff *edge;
  Index e;
  size_type in_stack_ffffffffffffff68;
  vector<BayesianGameIdenticalPayoff_*,_std::allocator<BayesianGameIdenticalPayoff_*>_>
  *in_stack_ffffffffffffff70;
  Index in_stack_ffffffffffffffac;
  BayesianGameBase *in_stack_ffffffffffffffb0;
  uint local_44;
  undefined1 local_40 [4];
  Index in_stack_ffffffffffffffc4;
  BayesianGameBase *in_stack_ffffffffffffffc8;
  uint local_14;
  
  lVar2 = (**(code **)(*in_RSI + 0x40))();
  in_RDI[0x22] = lVar2;
  (**(code **)(*(long *)in_RDI[0x22] + 0x38))();
  for (local_14 = 0; (ulong)local_14 < (ulong)in_RDI[0x1b]; local_14 = local_14 + 1) {
    ppBVar3 = std::
              vector<BayesianGameIdenticalPayoff_*,_std::allocator<BayesianGameIdenticalPayoff_*>_>
              ::at(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
    pBVar1 = *ppBVar3;
    (**(code **)(*in_RDI + 0xb0))(local_40,in_RDI,local_14);
    local_44 = 0;
    while( true ) {
      this_00 = (BayesianGameBase *)(ulong)local_44;
      pBVar4 = (BayesianGameBase *)BayesianGameBase::GetNrJointTypes(this_00);
      if (pBVar4 <= this_00) break;
      p_00 = BayesianGameBase::JointToIndividualTypeIndices
                       (in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc4);
      in_stack_ffffffffffffff70 =
           (vector<BayesianGameIdenticalPayoff_*,_std::allocator<BayesianGameIdenticalPayoff_*>_> *)
           (**(code **)(*(long *)in_RDI[0x22] + 0x20))((long *)in_RDI[0x22],local_40,p_00);
      BayesianGameBase::SetProbability
                (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac,(double)p_00);
      local_44 = local_44 + 1;
    }
    (*(pBVar1->super_BayesianGameIdenticalPayoffInterface).super_BayesianGameBase.
      super_Interface_ProblemToPolicyDiscretePure.super_Interface_ProblemToPolicyDiscrete.
      _vptr_Interface_ProblemToPolicyDiscrete[0xf])();
    Scope::~Scope((Scope *)0x8b0b0b);
  }
  return;
}

Assistant:

void BayesianGameCollaborativeGraphical::
SetProbabilityDistribution(const PDDiscreteInterface* pd)
{
    //first create a clone of the pd
    _m_jt_pd = pd->Clone(); 

    _m_jt_pd->SanityCheck();
    //next make sure that all the edges use consistent probs

    for(Index e = 0; e < _m_nrLRFs; e++)
    {   
        BayesianGameIdenticalPayoff& edge(*(_m_LRFs.at(e)) );
        const Scope& sc_e = GetScope(e);

        for(Index jtI_e=0; jtI_e < edge.GetNrJointTypes(); jtI_e++)
        {
            const vector<Index>& indTypes_e = edge.JointToIndividualTypeIndices(jtI_e);
            double p = _m_jt_pd->Get( sc_e, indTypes_e);
            edge.SetProbability(jtI_e, p);
        }
        edge.SanityCheck();
    }
    
}